

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  Select *pSVar1;
  sqlite3 *db;
  Expr *pLeft;
  char cVar2;
  undefined2 uVar3;
  u32 uVar4;
  Expr *pEVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Expr *pEVar10;
  Expr *pEVar11;
  Expr *pEVar12;
  Expr *pEVar13;
  Expr *pEVar14;
  byte bVar15;
  Expr t;
  
  bVar15 = 0;
  iVar9 = 0;
  if (pExpr->op != ',') {
    t._0_8_ = pWalker->pParse;
    pSVar1 = (pWalker->u).pSelect;
    t._40_8_ = pSVar1->pGroupBy;
    t.x._4_1_ = 1;
    t.u.zToken = (char *)exprNodeIsConstantOrGroupBy;
    t.pLeft = (Expr *)0x0;
    sqlite3WalkExpr((Walker *)&t,pExpr);
    iVar9 = 1;
    if (t.x._4_1_ != '\0') {
      db = pWalker->pParse->db;
      pEVar5 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens + 1,0);
      if (pEVar5 != (Expr *)0x0) {
        pLeft = pSVar1->pWhere;
        pEVar12 = &t;
        lVar8 = 9;
        pEVar10 = pEVar5;
        pEVar13 = pEVar12;
        for (lVar6 = lVar8; lVar7 = lVar8, pEVar11 = pExpr, pEVar14 = pEVar5, lVar6 != 0;
            lVar6 = lVar6 + -1) {
          cVar2 = pEVar10->affinity;
          uVar3 = *(undefined2 *)&pEVar10->field_0x2;
          uVar4 = pEVar10->flags;
          pEVar13->op = pEVar10->op;
          pEVar13->affinity = cVar2;
          *(undefined2 *)&pEVar13->field_0x2 = uVar3;
          pEVar13->flags = uVar4;
          pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar15 * -0x10 + 8);
          pEVar13 = (Expr *)((long)pEVar13 + (ulong)bVar15 * -0x10 + 8);
        }
        for (; lVar7 != 0; lVar7 = lVar7 + -1) {
          cVar2 = pEVar11->affinity;
          uVar3 = *(undefined2 *)&pEVar11->field_0x2;
          uVar4 = pEVar11->flags;
          pEVar14->op = pEVar11->op;
          pEVar14->affinity = cVar2;
          *(undefined2 *)&pEVar14->field_0x2 = uVar3;
          pEVar14->flags = uVar4;
          pEVar11 = (Expr *)((long)pEVar11 + (ulong)bVar15 * -0x10 + 8);
          pEVar14 = (Expr *)((long)pEVar14 + (ulong)bVar15 * -0x10 + 8);
        }
        for (; lVar8 != 0; lVar8 = lVar8 + -1) {
          cVar2 = pEVar12->affinity;
          uVar3 = *(undefined2 *)&pEVar12->field_0x2;
          uVar4 = pEVar12->flags;
          pExpr->op = pEVar12->op;
          pExpr->affinity = cVar2;
          *(undefined2 *)&pExpr->field_0x2 = uVar3;
          pExpr->flags = uVar4;
          pEVar12 = (Expr *)((long)pEVar12 + (ulong)bVar15 * -0x10 + 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar15 * -0x10 + 8);
        }
        pEVar5 = sqlite3ExprAnd(db,pLeft,pEVar5);
        pSVar1->pWhere = pEVar5;
        pWalker->eCode = '\x01';
      }
    }
  }
  return iVar9;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}